

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void Catch::Detail::registerReporterImpl(string *name,IReporterFactoryPtr *reporterPtr)

{
  IReporterFactoryPtr *pIVar1;
  IMutableRegistryHub *pIVar2;
  unique_ptr<Catch::IReporterFactory> local_30 [3];
  IReporterFactoryPtr *local_18;
  IReporterFactoryPtr *reporterPtr_local;
  string *name_local;
  
  local_18 = reporterPtr;
  reporterPtr_local = (IReporterFactoryPtr *)name;
  pIVar2 = getMutableRegistryHub();
  pIVar1 = reporterPtr_local;
  unique_ptr<Catch::IReporterFactory>::unique_ptr(local_30,reporterPtr);
  (*pIVar2->_vptr_IMutableRegistryHub[2])(pIVar2,pIVar1,local_30);
  unique_ptr<Catch::IReporterFactory>::~unique_ptr(local_30);
  return;
}

Assistant:

void registerReporterImpl( std::string const& name,
                                   IReporterFactoryPtr reporterPtr ) {
            CATCH_TRY {
                getMutableRegistryHub().registerReporter(
                    name, CATCH_MOVE( reporterPtr ) );
            }